

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::AppendTarget
          (cmExtraCodeBlocksGenerator *this,cmXMLWriter *xml,string *targetName,
          cmGeneratorTarget *target,char *make,cmLocalGenerator *lg,char *compiler,string *makeFlags
          )

{
  cmMakefile *this_00;
  string *makeFlags_00;
  _Alloc_hider _Var1;
  TargetType TVar2;
  char *pcVar3;
  cmExtraCodeBlocksGenerator *this_01;
  const_iterator cVar4;
  cmXMLWriter *this_02;
  pointer pbVar5;
  allocator local_189;
  string workingDir;
  string systemIncludeDirs;
  string buildType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  allocator local_f1;
  string location;
  int cbTargetType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allIncludeDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cdefs;
  string makefileName;
  
  this_00 = lg->Makefile;
  pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
  std::__cxx11::string::string((string *)&makefileName,pcVar3,(allocator *)&workingDir);
  std::__cxx11::string::append((char *)&makefileName);
  std::__cxx11::string::string((string *)&workingDir,"Target",(allocator *)&buildType);
  cmXMLWriter::StartElement(xml,&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  this_02 = xml;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"title",targetName);
  if (target == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string((string *)&workingDir,"Option",(allocator *)&buildType);
    cmXMLWriter::StartElement(xml,&workingDir);
    std::__cxx11::string::~string((string *)&workingDir);
    workingDir._M_dataplus._M_p = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    cmXMLWriter::Attribute<char_const*>(xml,"working_dir",(char **)&workingDir);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string((string *)&workingDir,"Option",(allocator *)&buildType);
    cmXMLWriter::StartElement(xml,&workingDir);
    std::__cxx11::string::~string((string *)&workingDir);
    workingDir._M_dataplus._M_p._0_4_ = 4;
    cmXMLWriter::Attribute<int>(xml,"type",(int *)&workingDir);
    cmXMLWriter::EndElement(xml);
  }
  else {
    cbTargetType = GetCBTargetType((cmExtraCodeBlocksGenerator *)this_02,target);
    pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    std::__cxx11::string::string((string *)&workingDir,pcVar3,(allocator *)&buildType);
    TVar2 = cmGeneratorTarget::GetType(target);
    if (TVar2 == EXECUTABLE) {
      std::__cxx11::string::string
                ((string *)&buildType,"CMAKE_RUNTIME_OUTPUT_DIRECTORY",(allocator *)&location);
      pcVar3 = cmMakefile::GetDefinition(this_00,&buildType);
      std::__cxx11::string::~string((string *)&buildType);
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&buildType,"EXECUTABLE_OUTPUT_PATH",(allocator *)&location);
        pcVar3 = cmMakefile::GetDefinition(this_00,&buildType);
        std::__cxx11::string::~string((string *)&buildType);
        if (pcVar3 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&workingDir);
        }
      }
      else {
        std::__cxx11::string::assign((char *)&workingDir);
      }
    }
    std::__cxx11::string::string
              ((string *)&location,"CMAKE_BUILD_TYPE",(allocator *)&systemIncludeDirs);
    this_01 = (cmExtraCodeBlocksGenerator *)cmMakefile::GetSafeDefinition(this_00,&location);
    std::__cxx11::string::string((string *)&buildType,(char *)this_01,(allocator *)&dirs);
    std::__cxx11::string::~string((string *)&location);
    location._M_dataplus._M_p = (pointer)&location.field_2;
    location._M_string_length = 0;
    location.field_2._M_local_buf[0] = '\0';
    TVar2 = cmGeneratorTarget::GetType(target);
    if (TVar2 == OBJECT_LIBRARY) {
      CreateDummyTargetFile_abi_cxx11_(&systemIncludeDirs,this_01,lg,target);
      std::__cxx11::string::operator=((string *)&location,(string *)&systemIncludeDirs);
      std::__cxx11::string::~string((string *)&systemIncludeDirs);
    }
    else {
      cmGeneratorTarget::GetLocation(target,&buildType);
      std::__cxx11::string::assign((char *)&location);
    }
    std::__cxx11::string::string((string *)&systemIncludeDirs,"Option",(allocator *)&dirs);
    cmXMLWriter::StartElement(xml,&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"output",&location);
    systemIncludeDirs._M_dataplus._M_p._0_4_ = 0;
    cmXMLWriter::Attribute<int>(xml,"prefix_auto",(int *)&systemIncludeDirs);
    systemIncludeDirs._M_dataplus._M_p._0_4_ = 0;
    cmXMLWriter::Attribute<int>(xml,"extension_auto",(int *)&systemIncludeDirs);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string((string *)&systemIncludeDirs,"Option",(allocator *)&dirs);
    cmXMLWriter::StartElement(xml,&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"working_dir",&workingDir);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string((string *)&systemIncludeDirs,"Option",(allocator *)&dirs);
    cmXMLWriter::StartElement(xml,&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    cmXMLWriter::Attribute<char[3]>(xml,"object_output",(char (*) [3])0x51ff4f);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string((string *)&systemIncludeDirs,"Option",(allocator *)&dirs);
    cmXMLWriter::StartElement(xml,&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    cmXMLWriter::Attribute<int>(xml,"type",&cbTargetType);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string((string *)&systemIncludeDirs,"Option",(allocator *)&dirs);
    cmXMLWriter::StartElement(xml,&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    cmXMLWriter::Attribute<char_const*>(xml,"compiler",&compiler);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string((string *)&systemIncludeDirs,"Compiler",(allocator *)&dirs);
    cmXMLWriter::StartElement(xml,&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    cdefs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cdefs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cdefs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&systemIncludeDirs,"C",(allocator *)&dirs);
    cmGeneratorTarget::GetCompileDefinitions(target,&cdefs,&buildType,&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    for (pbVar5 = cdefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != cdefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      std::__cxx11::string::string((string *)&systemIncludeDirs,"Add",(allocator *)&dirs);
      cmXMLWriter::StartElement(xml,&systemIncludeDirs);
      std::__cxx11::string::~string((string *)&systemIncludeDirs);
      std::operator+(&systemIncludeDirs,"-D",pbVar5);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"option",&systemIncludeDirs);
      std::__cxx11::string::~string((string *)&systemIncludeDirs);
      cmXMLWriter::EndElement(xml);
    }
    allIncludeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    allIncludeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    allIncludeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&systemIncludeDirs,"C",(allocator *)&dirs);
    cmLocalGenerator::GetIncludeDirectories(lg,&includes,target,&systemIncludeDirs,&buildType,true);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&allIncludeDirs,
               (const_iterator)
               allIncludeDirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::string
              ((string *)&dirs,"CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS",&local_189);
    pcVar3 = cmMakefile::GetSafeDefinition(this_00,(string *)&dirs);
    std::__cxx11::string::string((string *)&systemIncludeDirs,pcVar3,&local_f1);
    std::__cxx11::string::~string((string *)&dirs);
    if (systemIncludeDirs._M_string_length != 0) {
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&systemIncludeDirs,&dirs,false);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &allIncludeDirs,
                 (const_iterator)
                 allIncludeDirs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )dirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )dirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&dirs);
    }
    std::__cxx11::string::string
              ((string *)&dirs,"CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS",&local_189);
    cmMakefile::GetSafeDefinition(this_00,(string *)&dirs);
    std::__cxx11::string::assign((char *)&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&dirs);
    if (systemIncludeDirs._M_string_length != 0) {
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&systemIncludeDirs,&dirs,false);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &allIncludeDirs,
                 (const_iterator)
                 allIncludeDirs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )dirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )dirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&dirs);
    }
    cVar4 = cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&allIncludeDirs);
    for (pbVar5 = allIncludeDirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != cVar4._M_current;
        pbVar5 = pbVar5 + 1) {
      std::__cxx11::string::string((string *)&dirs,"Add",&local_189);
      cmXMLWriter::StartElement(xml,(string *)&dirs);
      std::__cxx11::string::~string((string *)&dirs);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"directory",pbVar5);
      cmXMLWriter::EndElement(xml);
    }
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&includes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&allIncludeDirs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cdefs);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::~string((string *)&buildType);
    std::__cxx11::string::~string((string *)&workingDir);
  }
  std::__cxx11::string::string((string *)&workingDir,"MakeCommands",(allocator *)&buildType);
  cmXMLWriter::StartElement(xml,&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::string((string *)&workingDir,"Build",(allocator *)&buildType);
  cmXMLWriter::StartElement(xml,&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::string((string *)&buildType,make,(allocator *)&location);
  makeFlags_00 = makeFlags;
  BuildMakeCommand(&workingDir,this,&buildType,makefileName._M_dataplus._M_p,targetName,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::~string((string *)&buildType);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string((string *)&workingDir,"CompileFile",(allocator *)&buildType);
  cmXMLWriter::StartElement(xml,&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::string((string *)&buildType,make,(allocator *)&systemIncludeDirs);
  _Var1 = makefileName._M_dataplus;
  std::__cxx11::string::string((string *)&location,"\"$file\"",(allocator *)&dirs);
  BuildMakeCommand(&workingDir,this,&buildType,_Var1._M_p,&location,makeFlags_00);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&buildType);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string((string *)&workingDir,"Clean",(allocator *)&buildType);
  cmXMLWriter::StartElement(xml,&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::string((string *)&buildType,make,(allocator *)&systemIncludeDirs);
  _Var1 = makefileName._M_dataplus;
  std::__cxx11::string::string((string *)&location,"clean",(allocator *)&dirs);
  BuildMakeCommand(&workingDir,this,&buildType,_Var1._M_p,&location,makeFlags_00);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&buildType);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string((string *)&workingDir,"DistClean",(allocator *)&buildType);
  cmXMLWriter::StartElement(xml,&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::string((string *)&buildType,make,(allocator *)&systemIncludeDirs);
  std::__cxx11::string::string((string *)&location,"clean",(allocator *)&dirs);
  BuildMakeCommand(&workingDir,this,&buildType,makefileName._M_dataplus._M_p,&location,makeFlags_00)
  ;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&workingDir);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&buildType);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::~string((string *)&makefileName);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::AppendTarget(
  cmXMLWriter& xml, const std::string& targetName, cmGeneratorTarget* target,
  const char* make, const cmLocalGenerator* lg, const char* compiler,
  const std::string& makeFlags)
{
  cmMakefile const* makefile = lg->GetMakefile();
  std::string makefileName = lg->GetCurrentBinaryDirectory();
  makefileName += "/Makefile";

  xml.StartElement("Target");
  xml.Attribute("title", targetName);

  if (target != CM_NULLPTR) {
    int cbTargetType = this->GetCBTargetType(target);
    std::string workingDir = lg->GetCurrentBinaryDirectory();
    if (target->GetType() == cmStateEnums::EXECUTABLE) {
      // Determine the directory where the executable target is created, and
      // set the working directory to this dir.
      const char* runtimeOutputDir =
        makefile->GetDefinition("CMAKE_RUNTIME_OUTPUT_DIRECTORY");
      if (runtimeOutputDir != CM_NULLPTR) {
        workingDir = runtimeOutputDir;
      } else {
        const char* executableOutputDir =
          makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
        if (executableOutputDir != CM_NULLPTR) {
          workingDir = executableOutputDir;
        }
      }
    }

    std::string buildType = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::string location;
    if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      location =
        this->CreateDummyTargetFile(const_cast<cmLocalGenerator*>(lg), target);
    } else {
      location = target->GetLocation(buildType);
    }

    xml.StartElement("Option");
    xml.Attribute("output", location);
    xml.Attribute("prefix_auto", 0);
    xml.Attribute("extension_auto", 0);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("working_dir", workingDir);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("object_output", "./");
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", cbTargetType);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("compiler", compiler);
    xml.EndElement();

    xml.StartElement("Compiler");

    // the compilerdefines for this target
    std::vector<std::string> cdefs;
    target->GetCompileDefinitions(cdefs, buildType, "C");

    // Expand the list.
    for (std::vector<std::string>::const_iterator di = cdefs.begin();
         di != cdefs.end(); ++di) {
      xml.StartElement("Add");
      xml.Attribute("option", "-D" + *di);
      xml.EndElement();
    }

    // the include directories for this target
    std::vector<std::string> allIncludeDirs;

    std::vector<std::string> includes;
    lg->GetIncludeDirectories(includes, target, "C", buildType);

    allIncludeDirs.insert(allIncludeDirs.end(), includes.begin(),
                          includes.end());

    std::string systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      allIncludeDirs.insert(allIncludeDirs.end(), dirs.begin(), dirs.end());
    }

    systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      allIncludeDirs.insert(allIncludeDirs.end(), dirs.begin(), dirs.end());
    }

    std::vector<std::string>::const_iterator end =
      cmRemoveDuplicates(allIncludeDirs);

    for (std::vector<std::string>::const_iterator i = allIncludeDirs.begin();
         i != end; ++i) {
      xml.StartElement("Add");
      xml.Attribute("directory", *i);
      xml.EndElement();
    }

    xml.EndElement(); // Compiler
  } else              // e.g. all and the GLOBAL and UTILITY targets
  {
    xml.StartElement("Option");
    xml.Attribute("working_dir", lg->GetCurrentBinaryDirectory());
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", 4);
    xml.EndElement();
  }

  xml.StartElement("MakeCommands");

  xml.StartElement("Build");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  targetName, makeFlags));
  xml.EndElement();

  xml.StartElement("CompileFile");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  "\"$file\"", makeFlags));
  xml.EndElement();

  xml.StartElement("Clean");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  "clean", makeFlags));
  xml.EndElement();

  xml.StartElement("DistClean");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  "clean", makeFlags));
  xml.EndElement();

  xml.EndElement(); // MakeCommands
  xml.EndElement(); // Target
}